

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastcgi_api.cpp
# Opt level: O2

const_buffer * __thiscall
cppcms::impl::cgi::fastcgi::format_output
          (const_buffer *__return_storage_ptr__,fastcgi *this,const_buffer *input,bool completed,
          error_code *param_3)

{
  ushort uVar1;
  entry *peVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ulong n;
  bool bVar6;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar7;
  ulong local_f8;
  size_t local_e0;
  buffer_impl<const_char_*> local_d8;
  mutable_buffer local_a8;
  fcgi_header *local_78;
  fcgi_header *local_70;
  size_t local_68;
  const_buffer in;
  
  in.super_buffer_impl<const_char_*>.size_ = 0;
  in.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  in.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  in.super_buffer_impl<const_char_*>.vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->response_headers_written_ == false) {
    booster::aio::buffer((const_buffer *)&local_a8,&this->response_headers_);
    booster::aio::operator+((const_buffer *)&local_d8,(const_buffer *)&local_a8,input);
    booster::aio::buffer_impl<const_char_*>::operator=
              (&in.super_buffer_impl<const_char_*>,&local_d8);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&local_d8.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base((_Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                     *)&local_a8.super_buffer_impl<char_*>.vec_);
    this->response_headers_written_ = true;
  }
  else {
    booster::aio::buffer_impl<const_char_*>::operator=
              (&in.super_buffer_impl<const_char_*>,&input->super_buffer_impl<const_char_*>);
  }
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).size_ = 0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_buffer_impl<const_char_*>).vec_.
  super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar7 = booster::aio::buffer_impl<const_char_*>::get(&in.super_buffer_impl<const_char_*>);
  peVar2 = pVar7.first;
  local_f8 = booster::aio::buffer_impl<const_char_*>::bytes_count
                       (&in.super_buffer_impl<const_char_*>);
  local_70 = &this->header_;
  local_78 = &this->full_header_;
  sVar5 = 0;
  local_68 = local_f8;
  while( true ) {
    if (local_f8 == 0) break;
    if (local_f8 < 0x10000) {
      (this->header_).version = '\x01';
      (this->header_).type = '\x06';
      (this->header_).request_id = 0;
      (this->header_).content_length = 0;
      (this->header_).padding_length = '\0';
      (this->header_).reserved = '\0';
      uVar1 = (ushort)this->request_id_;
      uVar3 = -(int)local_f8 & 7;
      (this->header_).padding_length = (uchar)uVar3;
      (this->header_).request_id = uVar1 << 8 | uVar1 >> 8;
      (this->header_).content_length = (ushort)local_f8 << 8 | (ushort)local_f8 >> 8;
      booster::aio::buffer(&local_a8,local_70,8);
      booster::aio::const_buffer::const_buffer((const_buffer *)&local_d8,&local_a8);
      booster::aio::details::add<booster::aio::const_buffer>
                (__return_storage_ptr__,(const_buffer *)&local_d8);
      std::
      _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ::~_Vector_base(&local_d8.vec_.
                       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                     );
      std::
      _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::~_Vector_base(&local_a8.super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                     );
      local_e0 = (size_t)uVar3;
      uVar4 = local_f8;
    }
    else {
      if (local_f8 == local_68) {
        (this->full_header_).version = '\x01';
        (this->full_header_).type = '\x06';
        uVar1 = (ushort)this->request_id_;
        (this->full_header_).padding_length = '\x01';
        (this->full_header_).request_id = uVar1 << 8 | uVar1 >> 8;
        (this->full_header_).content_length = 0xffff;
      }
      booster::aio::buffer(&local_a8,local_78,8);
      booster::aio::const_buffer::const_buffer((const_buffer *)&local_d8,&local_a8);
      booster::aio::details::add<booster::aio::const_buffer>
                (__return_storage_ptr__,(const_buffer *)&local_d8);
      std::
      _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ::~_Vector_base(&local_d8.vec_.
                       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                     );
      std::
      _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
      ::~_Vector_base(&local_a8.super_buffer_impl<char_*>.vec_.
                       super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                     );
      local_e0 = 1;
      uVar4 = 0xffff;
    }
    local_f8 = local_f8 - uVar4;
    while (uVar4 != 0) {
      n = peVar2->size - sVar5;
      if (uVar4 <= n) {
        n = uVar4;
      }
      booster::aio::buffer((const_buffer *)&local_d8,peVar2->ptr + sVar5,n);
      booster::aio::details::add<booster::aio::const_buffer>
                (__return_storage_ptr__,(const_buffer *)&local_d8);
      std::
      _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
      ::~_Vector_base(&local_d8.vec_.
                       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                     );
      sVar5 = sVar5 + n;
      uVar4 = uVar4 - n;
      bVar6 = sVar5 == peVar2->size;
      if (bVar6) {
        sVar5 = 0;
      }
      peVar2 = peVar2 + bVar6;
    }
    booster::aio::buffer((const_buffer *)&local_d8,"",local_e0);
    booster::aio::details::add<booster::aio::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_d8);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&local_d8.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
  }
  if (completed) {
    prepare_eof(this);
    booster::aio::buffer(&local_a8,&this->eof_,0x18);
    booster::aio::const_buffer::const_buffer((const_buffer *)&local_d8,&local_a8);
    booster::aio::details::add<booster::aio::const_buffer>
              (__return_storage_ptr__,(const_buffer *)&local_d8);
    std::
    _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
    ::~_Vector_base(&local_d8.vec_.
                     super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                   );
    std::
    _Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ::~_Vector_base(&local_a8.super_buffer_impl<char_*>.vec_.
                     super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                   );
  }
  std::
  _Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
  ::~_Vector_base(&in.super_buffer_impl<const_char_*>.vec_.
                   super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                 );
  return __return_storage_ptr__;
}

Assistant:

virtual booster::aio::const_buffer format_output(booster::aio::const_buffer const &input,bool completed,booster::system::error_code &)
		{
			booster::aio::const_buffer in;
			if(!response_headers_written_) {
				in=booster::aio::buffer(response_headers_) + input;
				response_headers_written_ = true;
			}
			else {
				in = input;
			}
			booster::aio::const_buffer packet;
			booster::aio::const_buffer::entry const *chunks = in.get().first;
//#define DEBUG_FASTCGI
#ifdef DEBUG_FASTCGI
			{
				size_t n=in.get().second;
				printf("Format output of %d:\n",int(in.bytes_count()));
				for(size_t i=0;i<n;i++) {
					printf("[%.*s]",int(chunks[i].size),chunks[i].ptr);
				}
				if(completed) {
					printf("\nEOF\n");
				}
				else {
					printf("\n---\n");
				}
			}
#endif
			size_t reminder = in.bytes_count();
			size_t in_size = reminder;
			size_t chunk_consumed = 0;
			while(reminder > 0) {
				static const char pad[8]={0,0,0,0,0,0,0,0};
				static const size_t max_packet_len = 65535;
				size_t chunk = 0;
				int pad_len = 0;
				if(reminder > max_packet_len) {
					chunk = max_packet_len;
					if(in_size > max_packet_len && reminder == in_size) {
						// prepare only once
						full_header_.version = fcgi_version_1;
						full_header_.type=fcgi_stdout;
						full_header_.request_id=request_id_;
						full_header_.content_length = max_packet_len;
						full_header_.padding_length = pad_len = 1;
						full_header_.to_net();
					}
					else {
						pad_len = 1;
					}
					packet += io::buffer(&full_header_,sizeof(full_header_));
				}
				else {
					chunk = reminder;
					memset(&header_,0,sizeof(header_));
					header_.version=fcgi_version_1;
					header_.type=fcgi_stdout;
					header_.request_id=request_id_;
					header_.content_length = reminder;
					header_.padding_length =pad_len = (8 - (reminder % 8)) % 8;
					header_.to_net();

					packet += io::buffer(&header_,sizeof(header_));
				}

				reminder -= chunk;
				while(chunk > 0) {
					size_t next_size = chunks->size - chunk_consumed;
					if(next_size > chunk)
						next_size = chunk;

					packet += io::buffer(chunks->ptr + chunk_consumed, next_size);
					chunk_consumed += next_size;
					chunk -= next_size;
					if(chunk_consumed == chunks->size) {
						chunks++;
						chunk_consumed = 0;
					}
				}

				packet += io::buffer(pad,pad_len);
			}
			if(completed) {
				prepare_eof();
				packet += io::buffer(&eof_,sizeof(eof_));
			}
			#ifdef DEBUG_FASTCGI
			std::pair<booster::aio::const_buffer::entry const *,size_t> cnk = packet.get();
			for(size_t i=0;i<cnk.second;i++) {
				std::cerr << "[ " << (void const *)(cnk.first[i].ptr) << " " << cnk.first[i].size << "]\n" << std::endl;
			}
			#endif
			return packet;
		}